

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::LossParameter::Clear(LossParameter *this)

{
  if (((this->_has_bits_).has_bits_[0] & 7) != 0) {
    this->normalize_ = false;
    this->ignore_label_ = 0;
    this->normalization_ = 1;
  }
  (this->_has_bits_).has_bits_[0] = 0;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  google::protobuf::internal::InternalMetadataWithArena::DoClear(&this->_internal_metadata_);
  return;
}

Assistant:

void LossParameter::Clear() {
// @@protoc_insertion_point(message_clear_start:caffe.LossParameter)
  if (_has_bits_[0 / 32] & 7u) {
    ::memset(&ignore_label_, 0, reinterpret_cast<char*>(&normalize_) -
      reinterpret_cast<char*>(&ignore_label_) + sizeof(normalize_));
    normalization_ = 1;
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}